

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

Am_Object Am_Get_Selection_Widget_For_Command(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *in_RSI;
  Am_Value v;
  Am_Object local_50;
  Am_Value local_48;
  Am_Value local_38;
  Am_Value local_28;
  
  pAVar2 = Am_Object::Get(in_RSI,0x197,1);
  Am_Value::Am_Value(&local_48,pAVar2);
  bVar1 = Am_Value::Valid(&local_48);
  if (bVar1) {
    pAVar2 = &local_28;
    Am_Value::Am_Value(pAVar2,&local_48);
    get_selection_widget((Am_Value *)cmd);
  }
  else {
    Am_Object::Get_Object(&local_50,(Am_Slot_Key)in_RSI,0x170);
    pAVar2 = Am_Object::Get(&local_50,0x197,1);
    Am_Value::operator=(&local_48,pAVar2);
    Am_Object::~Am_Object(&local_50);
    bVar1 = Am_Value::Valid(&local_48);
    if (!bVar1) {
      Am_Object::Am_Object(cmd,&Am_No_Object);
      goto LAB_0023825d;
    }
    pAVar2 = &local_38;
    Am_Value::Am_Value(pAVar2,&local_48);
    get_selection_widget((Am_Value *)cmd);
  }
  Am_Value::~Am_Value(pAVar2);
LAB_0023825d:
  Am_Value::~Am_Value(&local_48);
  return (Am_Object)(Am_Object_Data *)cmd;
}

Assistant:

Am_Object
Am_Get_Selection_Widget_For_Command(Am_Object cmd)
{

  Am_Value v = cmd.Peek(Am_SELECTION_WIDGET);

  if (v.Valid())
    return get_selection_widget(v);
  else {
    v = cmd.Get_Object(Am_SAVED_OLD_OWNER).Peek(Am_SELECTION_WIDGET);
    if (v.Valid())
      return get_selection_widget(v);
    else
      return Am_No_Object;
  }
}